

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5IndexExtractCol(u8 **pa,int n,int iCol)

{
  byte bVar1;
  int iVar2;
  u8 *puVar3;
  u8 *puVar4;
  bool bVar5;
  u8 *pEnd;
  u8 *p;
  uint local_20;
  int iCurrent;
  int iCol_local;
  int n_local;
  u8 **pa_local;
  
  p._4_4_ = 0;
  puVar3 = *pa + n;
  puVar4 = *pa;
  local_20 = iCol;
  iCurrent = n;
  _iCol_local = pa;
  do {
    pEnd = puVar4;
    if ((int)local_20 <= (int)p._4_4_) {
      if (local_20 == p._4_4_) {
        while( true ) {
          bVar5 = false;
          if (pEnd < puVar3) {
            bVar5 = *pEnd != '\x01';
          }
          if (!bVar5) break;
          do {
            puVar4 = pEnd + 1;
            bVar1 = *pEnd;
            pEnd = puVar4;
          } while ((bVar1 & 0x80) != 0);
        }
        pa_local._4_4_ = (int)pEnd - (int)*_iCol_local;
      }
      else {
        pa_local._4_4_ = 0;
      }
      return pa_local._4_4_;
    }
    while (*pEnd != '\x01') {
      do {
        puVar4 = pEnd + 1;
        bVar1 = *pEnd;
        pEnd = puVar4;
      } while ((bVar1 & 0x80) != 0);
      if (puVar3 <= puVar4) {
        return 0;
      }
    }
    *_iCol_local = pEnd;
    p._4_4_ = (uint)pEnd[1];
    puVar4 = pEnd + 2;
    if ((pEnd[1] & 0x80) != 0) {
      iVar2 = sqlite3Fts5GetVarint32(pEnd + 1,(u32 *)((long)&p + 4));
      puVar4 = pEnd + 1 + iVar2;
    }
  } while( true );
}

Assistant:

static int fts5IndexExtractCol(
  const u8 **pa,                  /* IN/OUT: Pointer to poslist */
  int n,                          /* IN: Size of poslist in bytes */
  int iCol                        /* Column to extract from poslist */
){
  int iCurrent = 0;               /* Anything before the first 0x01 is col 0 */
  const u8 *p = *pa;
  const u8 *pEnd = &p[n];         /* One byte past end of position list */

  while( iCol>iCurrent ){
    /* Advance pointer p until it points to pEnd or an 0x01 byte that is
    ** not part of a varint. Note that it is not possible for a negative
    ** or extremely large varint to occur within an uncorrupted position 
    ** list. So the last byte of each varint may be assumed to have a clear
    ** 0x80 bit.  */
    while( *p!=0x01 ){
      while( *p++ & 0x80 );
      if( p>=pEnd ) return 0;
    }
    *pa = p++;
    iCurrent = *p++;
    if( iCurrent & 0x80 ){
      p--;
      p += fts5GetVarint32(p, iCurrent);
    }
  }
  if( iCol!=iCurrent ) return 0;

  /* Advance pointer p until it points to pEnd or an 0x01 byte that is
  ** not part of a varint */
  while( p<pEnd && *p!=0x01 ){
    while( *p++ & 0x80 );
  }

  return p - (*pa);
}